

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O3

tnt_error tnt_io_connect(tnt_stream_net *s)

{
  addrinfo **ppaVar1;
  socklen_t __len;
  uri *puVar2;
  size_t sVar3;
  sockaddr *__addr;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  addrinfo *__ai;
  int iVar6;
  tnt_error tVar7;
  tnt_error tVar8;
  int *piVar9;
  int __timeout;
  char *__service;
  addrinfo *paVar10;
  char local_148 [8];
  char host [128];
  timeval start_connect;
  int local_58;
  int local_48;
  addrinfo *addr_info;
  pollfd local_38;
  pollfd fds [1];
  
  puVar2 = (s->opt).uri;
  if ((uint)puVar2->host_hint < 3) {
    __service = "3301";
    if (puVar2->service != (char *)0x0) {
      __service = puVar2->service;
    }
    sVar3 = puVar2->host_len;
    memcpy(local_148,puVar2->host,sVar3);
    local_148[sVar3] = '\0';
    _local_48 = (addrinfo *)0x0;
    host[0x78] = '\0';
    host[0x79] = '\0';
    host[0x7a] = '\0';
    host[0x7b] = '\0';
    host[0x7c] = '\0';
    host[0x7d] = '\0';
    host[0x7e] = '\0';
    host[0x7f] = '\0';
    iVar6 = getaddrinfo(local_148,__service,(addrinfo *)(host + 0x78),
                        (addrinfo **)&stack0xffffffffffffffb8);
    __ai = _local_48;
    tVar8 = TNT_ERESOLVE;
    paVar10 = _local_48;
    if (_local_48 != (addrinfo *)0x0 && iVar6 == 0) {
      do {
        iVar6 = socket(paVar10->ai_family,paVar10->ai_socktype,paVar10->ai_protocol);
        s->fd = iVar6;
        if (iVar6 < 0) {
          piVar9 = __errno_location();
          s->errno_ = *piVar9;
          tVar8 = TNT_ESYSTEM;
        }
        else {
          tVar7 = tnt_io_setopts(s);
          if (tVar7 == TNT_EOK) {
            __addr = paVar10->ai_addr;
            __len = paVar10->ai_addrlen;
            tVar7 = tnt_io_nonblock(s,1);
            if (tVar7 == TNT_EOK) {
              iVar6 = connect(s->fd,__addr,__len);
              if (iVar6 != -1) {
                tVar8 = TNT_EOK;
                break;
              }
              piVar9 = __errno_location();
              iVar6 = *piVar9;
              if (*piVar9 == 0x73) {
                iVar6 = gettimeofday((timeval *)(host + 0x78),(__timezone_ptr_t)0x0);
                if (iVar6 != -1) {
                  auVar4 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((s->opt).tmout_connect.tv_usec);
                  __timeout = ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) +
                              (int)(s->opt).tmout_connect.tv_sec * 1000;
                  uVar5 = CONCAT62(host._122_6_,host._120_2_);
                  do {
                    local_38.fd = s->fd;
                    local_38.events = 4;
                    iVar6 = poll(&local_38,1,__timeout);
                    if (iVar6 != -1) {
                      if (iVar6 != 0) {
                        _local_48 = (addrinfo *)((ulong)_local_48 & 0xffffffff00000000);
                        local_38.fd = 4;
                        iVar6 = getsockopt(s->fd,1,4,&stack0xffffffffffffffb8,(socklen_t *)&local_38
                                          );
                        if (local_48 != 0 || iVar6 == -1) {
                          iVar6 = local_48;
                          if (local_48 == 0) goto LAB_0010814e;
                          goto LAB_00108151;
                        }
                        tVar8 = TNT_EOK;
                        tVar7 = tnt_io_nonblock(s,0);
                        if (tVar7 != TNT_EOK) goto LAB_00107fc8;
                        goto LAB_00108288;
                      }
                      break;
                    }
                    iVar6 = *piVar9;
                    if ((iVar6 != 0xb) && (iVar6 != 4)) goto LAB_00108151;
                    iVar6 = gettimeofday((timeval *)&stack0xffffffffffffffb8,(__timezone_ptr_t)0x0);
                    if (iVar6 == -1) goto LAB_0010814e;
                    local_58 = (int)uVar5;
                    auVar4 = SEXT816((long)((long)&addr_info[-0x20000001].ai_next + 7)) *
                             SEXT816(0x20c49ba5e353f7cf);
                  } while (((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) +
                           (local_48 - local_58) * 1000 < __timeout);
                  tVar7 = TNT_ETMOUT;
                  goto LAB_00107fc8;
                }
LAB_0010814e:
                iVar6 = *piVar9;
              }
LAB_00108151:
              s->errno_ = iVar6;
              tVar7 = TNT_ESYSTEM;
            }
          }
LAB_00107fc8:
          tVar8 = tVar7;
          if (0 < s->fd) {
            close(s->fd);
            s->fd = -1;
          }
          s->connected = 0;
        }
        ppaVar1 = &paVar10->ai_next;
        paVar10 = *ppaVar1;
      } while (*ppaVar1 != (addrinfo *)0x0);
LAB_00108288:
      freeaddrinfo(__ai);
    }
    goto LAB_00108291;
  }
  if (puVar2->host_hint != 3) {
    return TNT_EFAIL;
  }
  sVar3 = puVar2->service_len;
  memcpy(local_148,puVar2->service,sVar3);
  local_148[sVar3] = '\0';
  iVar6 = socket(1,1,0);
  s->fd = iVar6;
  if (iVar6 < 0) {
    piVar9 = __errno_location();
    s->errno_ = *piVar9;
  }
  else {
    tVar8 = tnt_io_setopts(s);
    if (tVar8 != TNT_EOK) {
      if (0 < s->fd) {
        close(s->fd);
        s->fd = -1;
      }
      s->connected = 0;
      goto LAB_00108291;
    }
    host[0x7a] = '\0';
    host[0x7b] = '\0';
    host[0x7c] = '\0';
    host[0x7d] = '\0';
    host[0x7e] = '\0';
    host[0x7f] = '\0';
    host[0x78] = '\x01';
    host[0x79] = '\0';
    strcpy(host + 0x7a,local_148);
    iVar6 = connect(s->fd,(sockaddr *)(host + 0x78),0x6e);
    tVar8 = TNT_EOK;
    if (iVar6 != -1) goto LAB_00108291;
    piVar9 = __errno_location();
    s->errno_ = *piVar9;
    if (0 < s->fd) {
      close(s->fd);
      s->fd = -1;
    }
    s->connected = 0;
  }
  tVar8 = TNT_ESYSTEM;
LAB_00108291:
  if (tVar8 == TNT_EOK) {
    s->connected = 1;
    tVar8 = TNT_EOK;
  }
  return tVar8;
}

Assistant:

enum tnt_error
tnt_io_connect(struct tnt_stream_net *s)
{
	enum tnt_error result;
	struct uri *uri = s->opt.uri;
	switch (uri->host_hint) {
	case URI_NAME:
	case URI_IPV4:
	case URI_IPV6: {
		char host[128];
		const char *port = uri->service == NULL ? "3301" :
			uri->service;
		memcpy(host, uri->host, uri->host_len);
		host[uri->host_len] = '\0';
		result = tnt_io_connect_tcp(s, host, port);
		break;
	}
	case URI_UNIX: {
		char service[128];
		memcpy(service, uri->service, uri->service_len);
		service[uri->service_len] = '\0';
		result = tnt_io_connect_unix(s, service);
		break;
	}
	default:
		result = TNT_EFAIL;
	}
	if (result != TNT_EOK)
		return result;
	s->connected = 1;
	return TNT_EOK;
}